

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O0

char * hms_for_sec(time_t tv_sec)

{
  time_t tVar1;
  long local_20;
  time_t secs;
  tm *now;
  time_t tv_sec_local;
  
  if (tv_sec != hms_for_sec::cached_tv_sec) {
    now = (tm *)tv_sec;
    if (hms_for_sec::known_epoch == 0) {
      tVar1 = time((time_t *)0x0);
      hms_for_sec::epoch_offset = tVar1 - (long)now;
      hms_for_sec::known_epoch = 1;
    }
    local_20 = (long)&now->tm_sec + hms_for_sec::epoch_offset;
    secs = (time_t)localtime(&local_20);
    curl_msnprintf(hms_for_sec::hms_buf,0xc,"%02d:%02d:%02d",((tm *)secs)->tm_hour,
                   ((tm *)secs)->tm_min,((tm *)secs)->tm_sec);
    hms_for_sec::cached_tv_sec = (time_t)now;
  }
  return hms_for_sec::hms_buf;
}

Assistant:

static const char *hms_for_sec(time_t tv_sec)
{
  static time_t cached_tv_sec;
  static char hms_buf[12];
  static time_t epoch_offset;
  static int known_epoch;

  if(tv_sec != cached_tv_sec) {
    struct tm *now;
    time_t secs;
    /* recalculate */
    if(!known_epoch) {
      epoch_offset = time(NULL) - tv_sec;
      known_epoch = 1;
    }
    secs = epoch_offset + tv_sec;
    /* !checksrc! disable BANNEDFUNC 1 */
    now = localtime(&secs);  /* not thread safe but we do not care */
    msnprintf(hms_buf, sizeof(hms_buf), "%02d:%02d:%02d",
              now->tm_hour, now->tm_min, now->tm_sec);
    cached_tv_sec = tv_sec;
  }
  return hms_buf;
}